

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.cc
# Opt level: O1

int __thiscall tvm::runtime::GraphRuntime::GetInputIndex(GraphRuntime *this,string *name)

{
  uint uVar1;
  pointer puVar2;
  pointer pNVar3;
  pointer __s2;
  size_t sVar4;
  size_t __n;
  ulong uVar5;
  int iVar6;
  ostream *poVar7;
  ulong unaff_RBP;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  LogMessage local_48;
  
  iVar6 = (int)unaff_RBP;
  puVar2 = (this->input_nodes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(this->input_nodes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  bVar11 = lVar9 != 0;
  if (bVar11) {
    uVar10 = lVar9 >> 2;
    pNVar3 = (this->nodes_).
             super__Vector_base<tvm::runtime::GraphRuntime::Node,_std::allocator<tvm::runtime::GraphRuntime::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __s2 = (name->_M_dataplus)._M_p;
    sVar4 = name->_M_string_length;
    uVar8 = 0;
    do {
      uVar1 = puVar2[uVar8];
      __n = pNVar3[uVar1].name._M_string_length;
      if (__n == sVar4) {
        if (__n == 0) {
          bVar12 = true;
        }
        else {
          iVar6 = bcmp(pNVar3[uVar1].name._M_dataplus._M_p,__s2,__n);
          bVar12 = iVar6 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      uVar5 = unaff_RBP;
      if (bVar12) {
        uVar5 = uVar8;
      }
      unaff_RBP = uVar5 & 0xffffffff;
      iVar6 = (int)uVar5;
      if (bVar12) break;
      uVar8 = uVar8 + 1;
      bVar11 = uVar8 < uVar10;
    } while (uVar10 + (uVar10 == 0) != uVar8);
  }
  if (!bVar11) {
    dmlc::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_48.log_stream_,"Warning: cannot find \"",0x16);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_48.log_stream_,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" among input",0xd);
    dmlc::LogMessage::~LogMessage(&local_48);
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

int GraphRuntime::GetInputIndex(const std::string &name) {
  for (size_t i = 0; i < input_nodes_.size(); ++i) {
    uint32_t nid = input_nodes_[i];
    if (nodes_[nid].name == name) {
      return static_cast<int>(i);
    }
  }
  LOG(WARNING) << "Warning: cannot find \"" << name << "\" among input";
  return -1;
}